

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.h
# Opt level: O2

bool __thiscall ZXing::OneD::DataBar::Pair::operator==(Pair *this,Pair *o)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  
  if ((this->finder == o->finder) &&
     (iVar3 = -(uint)((o->left).value == (this->left).value),
     iVar4 = -(uint)((o->left).checksum == (this->left).checksum), auVar1._4_4_ = iVar3,
     auVar1._0_4_ = iVar3, auVar1._8_4_ = iVar4, auVar1._12_4_ = iVar4,
     iVar3 = movmskpd(this->finder,auVar1), iVar3 == 3)) {
    iVar3 = -(uint)((o->right).value == (this->right).value);
    iVar4 = -(uint)((o->right).checksum == (this->right).checksum);
    auVar2._4_4_ = iVar3;
    auVar2._0_4_ = iVar3;
    auVar2._8_4_ = iVar4;
    auVar2._12_4_ = iVar4;
    iVar3 = movmskpd(3,auVar2);
    return iVar3 == 3;
  }
  return false;
}

Assistant:

bool operator==(const Pair& o) const noexcept { return finder == o.finder && left == o.left && right == o.right; }